

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int biseqcstrcaseless(const_bstring b,char *s)

{
  byte bVar1;
  byte bVar2;
  uchar *puVar3;
  uint uVar4;
  __int32_t **pp_Var5;
  ulong uVar6;
  ulong uVar7;
  
  uVar4 = 0xffffffff;
  if (((s != (char *)0x0 && b != (const_bstring)0x0) &&
      (puVar3 = b->data, uVar4 = 0xffffffff, puVar3 != (uchar *)0x0)) &&
     (uVar7 = (ulong)(uint)b->slen, -1 < b->slen)) {
    if (uVar7 == 0) {
      uVar7 = 0;
    }
    else {
      uVar6 = 0;
      do {
        bVar1 = s[uVar6];
        if (((ulong)bVar1 == 0) ||
           ((bVar2 = puVar3[uVar6], bVar2 != bVar1 &&
            (pp_Var5 = __ctype_tolower_loc(), (*pp_Var5)[bVar2] != (uint)*(byte *)(*pp_Var5 + bVar1)
            )))) {
          return 0;
        }
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
    uVar4 = (uint)(s[uVar7] == '\0');
  }
  return uVar4;
}

Assistant:

int biseqcstrcaseless (const_bstring b, const char * s) {
int i;
	if (b == NULL || s == NULL || b->data == NULL || b->slen < 0)
		return BSTR_ERR;
	for (i=0; i < b->slen; i++) {
		if (s[i] == '\0' ||
		    (b->data[i] != (unsigned char) s[i] &&
		     downcase (b->data[i]) != (unsigned char) downcase (s[i])))
			return BSTR_OK;
	}
	return s[i] == '\0';
}